

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O0

void __thiscall
FastPForLib::PFor2008::uncompressblockPFOR<unsigned_short>
          (PFor2008 *this,uint32_t *inputbegin,DATATYPE *outputbegin,uint32_t b,unsigned_short **i,
          unsigned_short *end_exception,size_t next_exception)

{
  uint uVar1;
  ushort *puVar2;
  undefined4 in_ECX;
  long in_RDX;
  uint32_t *in_R8;
  uint32_t *in_R9;
  size_t cur;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  unpackblock((PFor2008 *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,in_R9,
              (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  while (*(uint32_t **)in_R8 != in_R9) {
    uVar1 = *(uint *)(in_RDX + (long)end_exception * 4);
    puVar2 = *(ushort **)in_R8;
    *(ushort **)in_R8 = puVar2 + 1;
    *(uint *)(in_RDX + (long)end_exception * 4) = (uint)*puVar2;
    end_exception = (unsigned_short *)((long)end_exception + (ulong)uVar1 + 1);
  }
  return;
}

Assistant:

void uncompressblockPFOR(
      const uint32_t
          *__restrict__ inputbegin, // points to the first packed word
      DATATYPE *__restrict__ outputbegin,
      const uint32_t b,
      const EXCEPTTYPE *__restrict__
          &i, // i points to value of the first exception
      const EXCEPTTYPE *__restrict__ end_exception,
      size_t next_exception // points to the position of the first exception
      ) {
    unpackblock(inputbegin, reinterpret_cast<uint32_t *>(outputbegin),
                b); /* bit-unpack the values */
    for (size_t cur = next_exception; i != end_exception;
         cur = next_exception) {
      next_exception = cur + static_cast<size_t>(outputbegin[cur]) + 1;
      outputbegin[cur] = *(i++);
    }
  }